

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

UINT8 nes_r_nsfplay(void *chip,UINT8 offset)

{
  UINT8 local_29;
  void *pvStack_28;
  UINT8 readVal;
  NESAPU_INF *info;
  void *pvStack_18;
  UINT8 offset_local;
  void *chip_local;
  
  pvStack_28 = chip;
  info._7_1_ = offset;
  pvStack_18 = chip;
  if (offset < 0x20) {
    local_29 = '\0';
    NES_APU_np_Read(chip,offset | 0x4000,&local_29);
    NES_DMC_np_Read(pvStack_28,info._7_1_ | 0x4000,&local_29);
    chip_local._7_1_ = local_29;
  }
  else if ((*(long *)((long)chip + 0x18) == 0) || (*(char *)((long)chip + 0x28) != '\0')) {
    chip_local._7_1_ = '\0';
  }
  else {
    chip_local._7_1_ = nes_read_fds(*(void **)((long)chip + 0x18),offset);
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 nes_r_nsfplay(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	if (offset < 0x20)	// NES APU
	{
		UINT8 readVal = 0x00;
		
		// the functions OR the result to the value
		NES_APU_np_Read(info, 0x4000 | offset, &readVal);
		NES_DMC_np_Read(info, 0x4000 | offset, &readVal);
		
		return readVal;
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}